

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

void Aig_Transfer_rec(Aig_Man_t *pDest,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p1;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pDest_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDfs.c"
                  ,0x381,"void Aig_Transfer_rec(Aig_Man_t *, Aig_Obj_t *)");
  }
  iVar1 = Aig_ObjIsNode(pObj);
  if ((iVar1 != 0) && (iVar1 = Aig_ObjIsMarkA(pObj), iVar1 == 0)) {
    pAVar2 = Aig_ObjFanin0(pObj);
    Aig_Transfer_rec(pDest,pAVar2);
    pAVar2 = Aig_ObjFanin1(pObj);
    Aig_Transfer_rec(pDest,pAVar2);
    pAVar2 = Aig_ObjChild0Copy(pObj);
    p1 = Aig_ObjChild1Copy(pObj);
    pAVar2 = Aig_And(pDest,pAVar2,p1);
    (pObj->field_5).pData = pAVar2;
    iVar1 = Aig_ObjIsMarkA(pObj);
    if (iVar1 != 0) {
      __assert_fail("!Aig_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDfs.c"
                    ,0x387,"void Aig_Transfer_rec(Aig_Man_t *, Aig_Obj_t *)");
    }
    Aig_ObjSetMarkA(pObj);
  }
  return;
}

Assistant:

void Aig_Transfer_rec( Aig_Man_t * pDest, Aig_Obj_t * pObj )
{
    assert( !Aig_IsComplement(pObj) );
    if ( !Aig_ObjIsNode(pObj) || Aig_ObjIsMarkA(pObj) )
        return;
    Aig_Transfer_rec( pDest, Aig_ObjFanin0(pObj) ); 
    Aig_Transfer_rec( pDest, Aig_ObjFanin1(pObj) );
    pObj->pData = Aig_And( pDest, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    assert( !Aig_ObjIsMarkA(pObj) ); // loop detection
    Aig_ObjSetMarkA( pObj );
}